

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Matrix33<float> * __thiscall
Imath_3_2::Matrix33<float>::operator-(Matrix33<float> *this,Matrix33<float> *v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Matrix33<float> *in_RDI;
  
  fVar1 = this->x[2][2];
  fVar2 = v->x[2][2];
  fVar3 = this->x[0][1];
  fVar4 = this->x[0][2];
  fVar5 = this->x[1][0];
  fVar6 = v->x[0][1];
  fVar7 = v->x[0][2];
  fVar8 = v->x[1][0];
  in_RDI->x[0][0] = this->x[0][0] - v->x[0][0];
  in_RDI->x[0][1] = fVar3 - fVar6;
  in_RDI->x[0][2] = fVar4 - fVar7;
  in_RDI->x[1][0] = fVar5 - fVar8;
  fVar3 = this->x[1][2];
  fVar4 = this->x[2][0];
  fVar5 = this->x[2][1];
  fVar6 = v->x[1][2];
  fVar7 = v->x[2][0];
  fVar8 = v->x[2][1];
  in_RDI->x[1][1] = this->x[1][1] - v->x[1][1];
  in_RDI->x[1][2] = fVar3 - fVar6;
  in_RDI->x[2][0] = fVar4 - fVar7;
  in_RDI->x[2][1] = fVar5 - fVar8;
  in_RDI->x[2][2] = fVar1 - fVar2;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE constexpr inline Matrix33<T>
Matrix33<T>::operator- (const Matrix33<T>& v) const IMATH_NOEXCEPT
{
    return Matrix33 (
        x[0][0] - v.x[0][0],
        x[0][1] - v.x[0][1],
        x[0][2] - v.x[0][2],
        x[1][0] - v.x[1][0],
        x[1][1] - v.x[1][1],
        x[1][2] - v.x[1][2],
        x[2][0] - v.x[2][0],
        x[2][1] - v.x[2][1],
        x[2][2] - v.x[2][2]);
}